

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

player_t * __thiscall player_t::operator=(player_t *this,player_t *p)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  AWeapon *pAVar5;
  undefined2 uVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  float fVar13;
  BYTE BVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  FName FVar20;
  float fVar21;
  float fVar22;
  
  this->mo = p->mo;
  this->playerstate = p->playerstate;
  uVar6 = *(undefined2 *)&(p->cmd).field_0x12;
  (this->cmd).consistancy = (p->cmd).consistancy;
  *(undefined2 *)&(this->cmd).field_0x12 = uVar6;
  sVar7 = (p->cmd).ucmd.pitch;
  sVar8 = (p->cmd).ucmd.yaw;
  sVar9 = (p->cmd).ucmd.roll;
  sVar10 = (p->cmd).ucmd.forwardmove;
  sVar11 = (p->cmd).ucmd.sidemove;
  sVar12 = (p->cmd).ucmd.upmove;
  (this->cmd).ucmd.buttons = (p->cmd).ucmd.buttons;
  (this->cmd).ucmd.pitch = sVar7;
  (this->cmd).ucmd.yaw = sVar8;
  (this->cmd).ucmd.roll = sVar9;
  (this->cmd).ucmd.forwardmove = sVar10;
  (this->cmd).ucmd.sidemove = sVar11;
  (this->cmd).ucmd.upmove = sVar12;
  sVar7 = (p->original_cmd).pitch;
  sVar8 = (p->original_cmd).yaw;
  sVar9 = (p->original_cmd).roll;
  sVar10 = (p->original_cmd).forwardmove;
  sVar11 = (p->original_cmd).sidemove;
  sVar12 = (p->original_cmd).upmove;
  (this->original_cmd).buttons = (p->original_cmd).buttons;
  (this->original_cmd).pitch = sVar7;
  (this->original_cmd).yaw = sVar8;
  (this->original_cmd).roll = sVar9;
  (this->original_cmd).forwardmove = sVar10;
  (this->original_cmd).sidemove = sVar11;
  (this->original_cmd).upmove = sVar12;
  this->original_oldbuttons = p->original_oldbuttons;
  this->cls = p->cls;
  fVar13 = p->FOV;
  this->DesiredFOV = p->DesiredFOV;
  this->FOV = fVar13;
  dVar1 = p->viewheight;
  this->viewz = p->viewz;
  this->viewheight = dVar1;
  dVar1 = p->bob;
  this->deltaviewheight = p->deltaviewheight;
  this->bob = dVar1;
  dVar1 = (p->Vel).Y;
  (this->Vel).X = (p->Vel).X;
  (this->Vel).Y = dVar1;
  BVar14 = p->turnticks;
  bVar15 = p->attackdown;
  bVar16 = p->usedown;
  this->centering = p->centering;
  this->turnticks = BVar14;
  this->attackdown = bVar15;
  this->usedown = bVar16;
  iVar17 = p->health;
  this->oldbuttons = p->oldbuttons;
  this->health = iVar17;
  this->inventorytics = p->inventorytics;
  this->CurrentPlayerClass = p->CurrentPlayerClass;
  uVar2 = *(undefined8 *)(p->frags + 2);
  uVar3 = *(undefined8 *)(p->frags + 4);
  uVar4 = *(undefined8 *)(p->frags + 6);
  *(undefined8 *)this->frags = *(undefined8 *)p->frags;
  *(undefined8 *)(this->frags + 2) = uVar2;
  *(undefined8 *)(this->frags + 4) = uVar3;
  *(undefined8 *)(this->frags + 6) = uVar4;
  iVar17 = p->lastkilltime;
  this->fragcount = p->fragcount;
  this->lastkilltime = iVar17;
  this->multicount = p->multicount;
  this->spreecount = p->spreecount;
  this->WeaponState = p->WeaponState;
  pAVar5 = p->PendingWeapon;
  this->ReadyWeapon = p->ReadyWeapon;
  this->PendingWeapon = pAVar5;
  iVar17 = p->timefreezer;
  this->cheats = p->cheats;
  this->timefreezer = iVar17;
  sVar7 = p->inconsistant;
  this->refire = p->refire;
  this->inconsistant = sVar7;
  this->waiting = p->waiting;
  iVar17 = p->itemcount;
  iVar18 = p->secretcount;
  iVar19 = p->damagecount;
  this->killcount = p->killcount;
  this->itemcount = iVar17;
  this->secretcount = iVar18;
  this->damagecount = iVar19;
  iVar17 = p->hazardcount;
  iVar18 = p->hazardinterval;
  FVar20.Index = (p->hazardtype).Index;
  this->bonuscount = p->bonuscount;
  this->hazardcount = iVar17;
  this->hazardinterval = iVar18;
  this->hazardtype = (FName)FVar20.Index;
  FVar20.Index = (p->poisontype).Index;
  this->poisoncount = p->poisoncount;
  this->poisontype = (FName)FVar20.Index;
  (this->poisonpaintype).Index = (p->poisonpaintype).Index;
  (this->poisoner).field_0 = (p->poisoner).field_0;
  (this->attacker).field_0 = (p->attacker).field_0;
  this->extralight = p->extralight;
  sVar7 = p->fixedlightlevel;
  this->fixedcolormap = p->fixedcolormap;
  this->fixedlightlevel = sVar7;
  (this->psprites).field_0 = (p->psprites).field_0;
  this->morphTics = p->morphTics;
  this->MorphedPlayerClass = p->MorphedPlayerClass;
  this->MorphStyle = p->MorphStyle;
  this->MorphExitFlash = p->MorphExitFlash;
  (this->PremorphWeapon).field_0 = (p->PremorphWeapon).field_0;
  iVar17 = p->jumpTics;
  this->chickenPeck = p->chickenPeck;
  this->jumpTics = iVar17;
  this->onground = p->onground;
  this->respawn_time = p->respawn_time;
  (this->camera).field_0 = (p->camera).field_0;
  FVar20.Index = (p->LastDamageType).Index;
  this->air_finished = p->air_finished;
  this->LastDamageType = (FName)FVar20.Index;
  (this->Bot).field_0 = (p->Bot).field_0;
  this->settings_controller = p->settings_controller;
  fVar13 = p->BlendG;
  fVar21 = p->BlendB;
  fVar22 = p->BlendA;
  this->BlendR = p->BlendR;
  this->BlendG = fVar13;
  this->BlendB = fVar21;
  this->BlendA = fVar22;
  FString::operator=(&this->LogText,&p->LogText);
  (this->MinPitch).Degrees = (p->MinPitch).Degrees;
  this->crouching = p->crouching;
  this->crouchdir = p->crouchdir;
  dVar1 = p->crouchfactor;
  (this->MaxPitch).Degrees = (p->MaxPitch).Degrees;
  this->crouchfactor = dVar1;
  dVar1 = p->crouchviewdelta;
  this->crouchoffset = p->crouchoffset;
  this->crouchviewdelta = dVar1;
  FWeaponSlots::operator=(&this->weapons,&p->weapons);
  (this->ConversationNPC).field_0 = (p->ConversationNPC).field_0;
  (this->ConversationPC).field_0 = (p->ConversationPC).field_0;
  (this->ConversationNPCAngle).Degrees = (p->ConversationNPCAngle).Degrees;
  this->ConversationFaceTalker = p->ConversationFaceTalker;
  (this->MUSINFOactor).field_0 = (p->MUSINFOactor).field_0;
  this->MUSINFOtics = p->MUSINFOtics;
  return this;
}

Assistant:

player_t &player_t::operator=(const player_t &p)
{
	mo = p.mo;
	playerstate = p.playerstate;
	cmd = p.cmd;
	original_cmd = p.original_cmd;
	original_oldbuttons = p.original_oldbuttons;
	// Intentionally not copying userinfo!
	cls = p.cls;
	DesiredFOV = p.DesiredFOV;
	FOV = p.FOV;
	viewz = p.viewz;
	viewheight = p.viewheight;
	deltaviewheight = p.deltaviewheight;
	bob = p.bob;
	Vel = p.Vel;
	centering = p.centering;
	turnticks = p.turnticks;
	attackdown = p.attackdown;
	usedown = p.usedown;
	oldbuttons = p.oldbuttons;
	health = p.health;
	inventorytics = p.inventorytics;
	CurrentPlayerClass = p.CurrentPlayerClass;
	memcpy(frags, &p.frags, sizeof(frags));
	fragcount = p.fragcount;
	lastkilltime = p.lastkilltime;
	multicount = p.multicount;
	spreecount = p.spreecount;
	WeaponState = p.WeaponState;
	ReadyWeapon = p.ReadyWeapon;
	PendingWeapon = p.PendingWeapon;
	cheats = p.cheats;
	timefreezer = p.timefreezer;
	refire = p.refire;
	inconsistant = p.inconsistant;
	waiting = p.waiting;
	killcount = p.killcount;
	itemcount = p.itemcount;
	secretcount = p.secretcount;
	damagecount = p.damagecount;
	bonuscount = p.bonuscount;
	hazardcount = p.hazardcount;
	hazardtype = p.hazardtype;
	hazardinterval = p.hazardinterval;
	poisoncount = p.poisoncount;
	poisontype = p.poisontype;
	poisonpaintype = p.poisonpaintype;
	poisoner = p.poisoner;
	attacker = p.attacker;
	extralight = p.extralight;
	fixedcolormap = p.fixedcolormap;
	fixedlightlevel = p.fixedlightlevel;
	psprites = p.psprites;
	morphTics = p.morphTics;
	MorphedPlayerClass = p.MorphedPlayerClass;
	MorphStyle = p.MorphStyle;
	MorphExitFlash = p.MorphExitFlash;
	PremorphWeapon = p.PremorphWeapon;
	chickenPeck = p.chickenPeck;
	jumpTics = p.jumpTics;
	onground = p.onground;
	respawn_time = p.respawn_time;
	camera = p.camera;
	air_finished = p.air_finished;
	LastDamageType = p.LastDamageType;
	Bot = p.Bot;
	settings_controller = p.settings_controller;
	BlendR = p.BlendR;
	BlendG = p.BlendG;
	BlendB = p.BlendB;
	BlendA = p.BlendA;
	LogText = p.LogText;
	MinPitch = p.MinPitch;
	MaxPitch = p.MaxPitch;
	crouching = p.crouching;
	crouchdir = p.crouchdir;
	crouchfactor = p.crouchfactor;
	crouchoffset = p.crouchoffset;
	crouchviewdelta = p.crouchviewdelta;
	weapons = p.weapons;
	ConversationNPC = p.ConversationNPC;
	ConversationPC = p.ConversationPC;
	ConversationNPCAngle = p.ConversationNPCAngle;
	ConversationFaceTalker = p.ConversationFaceTalker;
	MUSINFOactor = p.MUSINFOactor;
	MUSINFOtics = p.MUSINFOtics;
	return *this;
}